

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vfy.c
# Opt level: O0

int check_delta_base(X509_CRL *delta,X509_CRL *base)

{
  int iVar1;
  X509_NAME *a;
  X509_NAME *b;
  X509_CRL *in_RSI;
  X509_CRL *in_RDI;
  int nid;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  uint uVar2;
  
  if (in_RDI->base_crl_number == (ASN1_INTEGER *)0x0) {
    uVar2 = 0;
  }
  else if (in_RSI->crl_number == (ASN1_INTEGER *)0x0) {
    uVar2 = 0;
  }
  else {
    a = X509_CRL_get_issuer(in_RSI);
    b = X509_CRL_get_issuer(in_RDI);
    iVar1 = X509_NAME_cmp((X509_NAME *)a,(X509_NAME *)b);
    if (iVar1 == 0) {
      nid = (int)((ulong)in_RSI >> 0x20);
      iVar1 = crl_extension_match((X509_CRL *)
                                  CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                  in_RDI,nid);
      if (iVar1 == 0) {
        uVar2 = 0;
      }
      else {
        iVar1 = crl_extension_match((X509_CRL *)
                                    CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                    in_RDI,nid);
        if (iVar1 == 0) {
          uVar2 = 0;
        }
        else {
          iVar1 = ASN1_INTEGER_cmp((ASN1_INTEGER *)in_RDI->base_crl_number,
                                   (ASN1_INTEGER *)in_RSI->crl_number);
          if (iVar1 < 1) {
            iVar1 = ASN1_INTEGER_cmp((ASN1_INTEGER *)in_RDI->crl_number,
                                     (ASN1_INTEGER *)in_RSI->crl_number);
            uVar2 = (uint)(0 < iVar1);
          }
          else {
            uVar2 = 0;
          }
        }
      }
    }
    else {
      uVar2 = 0;
    }
  }
  return uVar2;
}

Assistant:

static int check_delta_base(X509_CRL *delta, X509_CRL *base)
{
    /* Delta CRL must be a delta */
    if (delta->base_crl_number == NULL)
        return 0;
    /* Base must have a CRL number */
    if (base->crl_number == NULL)
        return 0;
    /* Issuer names must match */
    if (X509_NAME_cmp(X509_CRL_get_issuer(base),
                      X509_CRL_get_issuer(delta)) != 0)
        return 0;
    /* AKID and IDP must match */
    if (!crl_extension_match(delta, base, NID_authority_key_identifier))
        return 0;
    if (!crl_extension_match(delta, base, NID_issuing_distribution_point))
        return 0;
    /* Delta CRL base number must not exceed Full CRL number. */
    if (ASN1_INTEGER_cmp(delta->base_crl_number, base->crl_number) > 0)
        return 0;
    /* Delta CRL number must exceed full CRL number */
    return ASN1_INTEGER_cmp(delta->crl_number, base->crl_number) > 0;
}